

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void SetPixelColor(void *dstPtr,Color color,int format)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (6 < format - 1U) {
    return;
  }
  uVar3 = (uint)color >> 8;
  uVar2 = (uint)color >> 0x10;
  switch(format) {
  case 1:
    *(char *)dstPtr =
         (char)(int)((((float)(uVar2 & 0xff) / 255.0) * 0.114 +
                     ((float)(uVar3 & 0xff) / 255.0) * 0.587 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299) * 255.0);
    break;
  case 2:
    *(char *)dstPtr =
         (char)(int)((((float)(uVar2 & 0xff) / 255.0) * 0.114 +
                     ((float)(uVar3 & 0xff) / 255.0) * 0.587 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299) * 255.0);
    *(uchar *)((long)dstPtr + 1) = color.a;
    break;
  case 3:
    fVar4 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    fVar5 = roundf(((float)(uVar3 & 0xff) / 255.0) * 63.0);
    fVar6 = roundf(((float)(uVar2 & 0xff) / 255.0) * 31.0);
    uVar1 = (ushort)(int)fVar6 & 0xff | (ushort)((int)fVar4 << 0xb) |
            (ushort)(((int)fVar5 & 0xffU) << 5);
    goto LAB_00150744;
  case 4:
    *(uchar *)dstPtr = color.r;
    *(uchar *)((long)dstPtr + 1) = color.g;
    *(uchar *)((long)dstPtr + 2) = color.b;
    break;
  case 5:
    fVar4 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    fVar5 = roundf(((float)(uVar3 & 0xff) / 255.0) * 31.0);
    fVar6 = roundf(((float)(uVar2 & 0xff) / 255.0) * 31.0);
    *(ushort *)dstPtr =
         (ushort)(0.19607843 < (float)((uint)color >> 0x18) / 255.0) | (ushort)((int)fVar4 << 0xb) |
         (ushort)(((int)fVar5 & 0xffU) << 6) | ((ushort)(int)fVar6 & 0xff) * 2;
    break;
  case 6:
    fVar4 = roundf(((float)((uint)color & 0xff) / 255.0) * 15.0);
    fVar5 = roundf(((float)(uVar3 & 0xff) / 255.0) * 15.0);
    fVar6 = roundf(((float)(uVar2 & 0xff) / 255.0) * 15.0);
    fVar7 = roundf(((float)((uint)color >> 0x18) / 255.0) * 15.0);
    uVar1 = (ushort)(int)fVar7 & 0xff | (ushort)((int)fVar4 << 0xc) | (ushort)((int)fVar5 << 8) |
            (ushort)(((int)fVar6 & 0xffU) << 4);
LAB_00150744:
    *(ushort *)dstPtr = uVar1;
    break;
  case 7:
    *(uchar *)dstPtr = color.r;
    *(uchar *)((long)dstPtr + 1) = color.g;
    *(uchar *)((long)dstPtr + 2) = color.b;
    *(uchar *)((long)dstPtr + 3) = color.a;
  }
  return;
}

Assistant:

void SetPixelColor(void *dstPtr, Color color, int format)
{
    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;
            ((unsigned char *)dstPtr)[1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;
            ((unsigned char *)dstPtr)[3] = color.a;

        } break;
        default: break;
    }
}